

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int xmlXPathSetContextNode(xmlNodePtr node,xmlXPathContextPtr ctx)

{
  if ((ctx != (xmlXPathContextPtr)0x0 && node != (xmlNodePtr)0x0) && (node->doc == ctx->doc)) {
    ctx->node = node;
    return 0;
  }
  return -1;
}

Assistant:

int
xmlXPathSetContextNode(xmlNodePtr node, xmlXPathContextPtr ctx) {
    if ((node == NULL) || (ctx == NULL))
        return(-1);

    if (node->doc == ctx->doc) {
        ctx->node = node;
	return(0);
    }
    return(-1);
}